

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gabby.cc
# Opt level: O2

void __thiscall GB::add_n(GB *this)

{
  u8 x;
  
  if ((this->s).op_tick == 0xe) {
    x = read_n(this);
    add(this,x,'\0');
    (this->s).op_tick = -2;
  }
  return;
}

Assistant:

void GB::add_n() {
  switch (s.op_tick) {
    case 14: add(read_n()); op_done(); break;
  }
}